

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_dropt.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  bool bVar47;
  bool bVar48;
  bool bVar49;
  bool bVar50;
  bool bVar51;
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  bool bVar69;
  bool bVar70;
  bool bVar71;
  bool bVar72;
  bool bVar73;
  bool bVar74;
  bool bVar75;
  bool bVar76;
  bool bVar77;
  bool bVar78;
  bool bVar79;
  bool bVar80;
  bool bVar81;
  bool bVar82;
  bool bVar83;
  bool bVar84;
  bool bVar85;
  bool bVar86;
  bool bVar87;
  dropt_error dVar88;
  char *pcVar89;
  long lVar90;
  dropt_context *context;
  long *plVar91;
  byte bVar92;
  bool bVar93;
  dropt_help_params helpParams;
  
  pcVar89 = (char *)dropt_strndup("foo bar");
  if (pcVar89 == (char *)0x0) {
    main_cold_12();
LAB_001066eb:
    bVar93 = false;
    uVar10 = 0;
  }
  else {
    iVar4 = strcmp(pcVar89,"foo");
    if (iVar4 != 0) {
      main_cold_1();
    }
    free(pcVar89);
    pcVar89 = (char *)dropt_strndup("foo bar");
    if (pcVar89 == (char *)0x0) {
      main_cold_11();
      goto LAB_001066eb;
    }
    iVar5 = strcmp(pcVar89,"foo bar");
    if (iVar5 != 0) {
      main_cold_2();
    }
    free(pcVar89);
    pcVar89 = (char *)dropt_strdup("foo bar");
    if (pcVar89 == (char *)0x0) {
      main_cold_10();
      goto LAB_001066eb;
    }
    iVar6 = strcmp(pcVar89,"foo bar");
    if (iVar6 != 0) {
      main_cold_3();
    }
    free(pcVar89);
    iVar7 = dropt_strnicmp("foo bar","FOO QUX",4);
    if (iVar7 != 0) {
      main_cold_4();
    }
    iVar8 = dropt_strnicmp("foo bar","FOO QUX",5);
    if (-1 < iVar8) {
      main_cold_5();
    }
    iVar9 = dropt_strnicmp("FOO QUX","foo bar",5);
    if (iVar9 < 1) {
      main_cold_6();
    }
    uVar10 = dropt_stricmp("foo bar","FOO QUX");
    if (-1 < (int)uVar10) {
      main_cold_7();
    }
    iVar11 = dropt_stricmp("FOO QUX","foo bar");
    if (iVar11 < 1) {
      main_cold_8();
    }
    uVar10 = uVar10 >> 0x1f;
    iVar12 = dropt_stricmp("foo");
    if (iVar12 != 0) {
      main_cold_9();
      uVar10 = 0;
    }
    if ((((((iVar5 != 0 || iVar4 != 0) || iVar6 != 0) || iVar7 != 0) || -1 < iVar8) || iVar9 < 1) ||
        iVar11 < 1) {
      uVar10 = 0;
    }
    bVar93 = true;
  }
  if (bVar93) {
    helpParams._0_8_ = helpParams._0_8_ & 0xffffffff00000000;
    iVar4 = dropt_snprintf(&helpParams,4,"%s","foo");
    if (iVar4 != 3) {
      main_cold_13();
    }
    uVar2 = helpParams.indent;
    if (helpParams.indent != 0x6f6f66) {
      main_cold_14();
    }
    helpParams._0_8_ = helpParams._0_8_ & 0xffffffff00000000;
    iVar5 = dropt_snprintf(&helpParams,4,"%s","bar baz");
    if (iVar5 != 7) {
      main_cold_15();
    }
    uVar3 = helpParams.indent;
    if (helpParams.indent != 0x726162) {
      main_cold_16();
    }
    lVar90 = dropt_ssopen();
    if (lVar90 == 0) {
      main_cold_21();
      uVar10 = 0;
    }
    else {
      pcVar89 = (char *)dropt_ssgetstring(lVar90);
      cVar1 = *pcVar89;
      if (cVar1 != '\0') {
        main_cold_17();
      }
      iVar6 = dropt_ssprintf(lVar90,"hello %s %X %d%c","world",0xcafebabe,0x7a69,0x21);
      if (iVar6 != 0x1b) {
        main_cold_18();
      }
      dropt_ssprintf(lVar90,"%c",10);
      dropt_ssprintf(lVar90,"Lorem ipsum dolor sit amet, consectetuer adipiscing elit. ");
      dropt_ssprintf(lVar90,"Aenean quis mauris. In augue. ");
      dropt_ssprintf(lVar90,
                     "Suspendisse orci felis, tristique eget, lacinia rhoncus, interdum at, lorem.")
      ;
      dropt_ssprintf(lVar90,"Aliquam gravida dui nec erat. Integer pede. Aliquam erat volutpat.");
      dropt_ssprintf(lVar90,"In eu nisl. Curabitur non tellus id arcu feugiat porta orci aliquam.");
      iVar7 = dropt_ssprintf(lVar90,"%c",0);
      if (iVar7 != 1) {
        main_cold_19();
      }
      dropt_ssprintf(lVar90);
      pcVar89 = (char *)dropt_ssfinalize(lVar90);
      if (pcVar89 == (char *)0x0) {
        bVar93 = false;
      }
      else {
        iVar8 = strcmp(pcVar89,
                       "hello world CAFEBABE 31337!\nLorem ipsum dolor sit amet, consectetuer adipiscing elit. Aenean quis mauris. In augue. Suspendisse orci felis, tristique eget, lacinia rhoncus, interdum at, lorem.Aliquam gravida dui nec erat. Integer pede. Aliquam erat volutpat.In eu nisl. Curabitur non tellus id arcu feugiat porta orci aliquam."
                      );
        bVar93 = iVar8 == 0;
      }
      if (bVar93 == false) {
        main_cold_20();
      }
      uVar13 = bVar93 & uVar10;
      uVar10 = 0;
      if ((((((iVar4 == 3 && iVar5 == 7) && uVar2 == 0x6f6f66) && uVar3 == 0x726162) &&
           cVar1 == '\0') && iVar6 == 0x1b) && iVar7 == 1) {
        uVar10 = uVar13;
      }
      free(pcVar89);
    }
  }
  bVar92 = 1;
  if (uVar10 != 0) {
    context = (dropt_context *)dropt_new_context(options);
    if (context != (dropt_context *)0x0) {
      bVar14 = test_dropt_handle_bool(context,(dropt_char *)0x0,0,'\x01','\0',0x1fb);
      bVar15 = test_dropt_handle_bool(context,(dropt_char *)0x0,0,'\x01','\0',0x1fc);
      bVar16 = test_dropt_handle_bool(context,"",6,'\0','\0',0x1fd);
      bVar17 = test_dropt_handle_bool(context," ",6,'\0','\0',0x1fe);
      bVar18 = test_dropt_handle_bool(context,"1",0,'\x01','\0',0x1ff);
      bVar19 = test_dropt_handle_bool(context,"0",0,'\0','\0',0x200);
      bVar20 = test_dropt_handle_bool(context,"2",6,'\0','\0',0x201);
      bVar21 = test_dropt_handle_bool(context,"-1",6,'\0','\0',0x202);
      bVar22 = test_dropt_handle_bool(context,"01",0,'\x01','\0',0x203);
      bVar23 = test_dropt_handle_bool(context,"11",6,'\0','\0',0x204);
      bVar24 = test_dropt_handle_bool(context,"a",6,'\0','\0',0x205);
      bVar25 = test_dropt_handle_bool(context,"a",6,'\x01','\x01',0x206);
      bVar26 = test_dropt_handle_bool(context,"true",6,'\0','\0',0x207);
      bVar27 = test_dropt_handle_bool(context,"false",6,'\0','\0',0x208);
      bVar28 = test_dropt_handle_bool(context,"3000000000",6,'\0','\0',0x209);
      bVar29 = test_dropt_handle_bool(context,"-3000000000",6,'\0','\0',0x20a);
      bVar30 = test_dropt_handle_bool(context,"5000000000",6,'\0','\0',0x20b);
      bVar31 = test_dropt_handle_verbose_bool(context,(dropt_char *)0x0,0,'\x01','\0',0x20d);
      bVar32 = test_dropt_handle_verbose_bool(context,"",6,'\0','\0',0x20e);
      bVar33 = test_dropt_handle_verbose_bool(context," ",6,'\0','\0',0x20f);
      bVar34 = test_dropt_handle_verbose_bool(context,"1",0,'\x01','\0',0x210);
      bVar35 = test_dropt_handle_verbose_bool(context,"0",0,'\0','\0',0x211);
      bVar36 = test_dropt_handle_verbose_bool(context,"2",6,'\0','\0',0x212);
      bVar37 = test_dropt_handle_verbose_bool(context,"-1",6,'\0','\0',0x213);
      bVar38 = test_dropt_handle_verbose_bool(context,"01",0,'\x01','\0',0x214);
      bVar39 = test_dropt_handle_verbose_bool(context,"11",6,'\0','\0',0x215);
      bVar40 = test_dropt_handle_verbose_bool(context,"a",6,'\0','\0',0x216);
      bVar41 = test_dropt_handle_verbose_bool(context,"a",6,'\x01','\x01',0x217);
      bVar42 = test_dropt_handle_verbose_bool(context,"true",0,'\x01','\0',0x218);
      bVar43 = test_dropt_handle_verbose_bool(context,"false",0,'\0','\0',0x219);
      bVar44 = test_dropt_handle_int(context,(dropt_char *)0x0,5,0x2a,0x2a,0x21b);
      bVar45 = test_dropt_handle_int(context,"",5,0x2a,0x2a,0x21c);
      bVar46 = test_dropt_handle_int(context," ",6,0x2a,0x2a,0x21d);
      bVar47 = test_dropt_handle_int(context,"0",0,0,0,0x21e);
      bVar48 = test_dropt_handle_int(context,"-0",0,0,0,0x21f);
      bVar49 = test_dropt_handle_int(context,"123",0,0x7b,0,0x220);
      bVar50 = test_dropt_handle_int(context,"0123",0,0x7b,0,0x221);
      bVar51 = test_dropt_handle_int(context,"+123",0,0x7b,0,0x222);
      bVar52 = test_dropt_handle_int(context,"-123",0,-0x7b,0,0x223);
      bVar53 = test_dropt_handle_int(context,"12.3",6,0x2a,0x2a,0x224);
      bVar54 = test_dropt_handle_int(context,"a",6,0x2a,0x2a,0x225);
      bVar55 = test_dropt_handle_int(context,"123a",6,0x2a,0x2a,0x226);
      bVar56 = test_dropt_handle_int(context,"3000000000",7,0x2a,0x2a,0x227);
      bVar57 = test_dropt_handle_int(context,"-3000000000",7,0x2a,0x2a,0x228);
      bVar58 = test_dropt_handle_uint(context,(dropt_char *)0x0,5,0xcafebabe,0xcafebabe,0x22a);
      bVar59 = test_dropt_handle_uint(context,"",5,0xcafebabe,0xcafebabe,0x22b);
      bVar60 = test_dropt_handle_uint(context," ",6,0xcafebabe,0xcafebabe,0x22c);
      bVar61 = test_dropt_handle_uint(context,"0",0,0,0,0x22d);
      bVar62 = test_dropt_handle_uint(context,"-0",6,0xcafebabe,0xcafebabe,0x22e);
      bVar63 = test_dropt_handle_uint(context,"123",0,0x7b,0,0x22f);
      bVar64 = test_dropt_handle_uint(context,"0123",0,0x7b,0,0x230);
      bVar65 = test_dropt_handle_uint(context,"123",0,0x7b,0,0x231);
      bVar66 = test_dropt_handle_uint(context,"+123",0,0x7b,0,0x232);
      bVar67 = test_dropt_handle_uint(context,"-123",6,0xcafebabe,0xcafebabe,0x233);
      bVar68 = test_dropt_handle_uint(context,"12.3",6,0xcafebabe,0xcafebabe,0x234);
      bVar69 = test_dropt_handle_uint(context,"a",6,0xcafebabe,0xcafebabe,0x235);
      bVar70 = test_dropt_handle_uint(context,"123a",6,0xcafebabe,0xcafebabe,0x236);
      bVar71 = test_dropt_handle_uint(context,"3000000000",0,3000000000,0,0x237);
      bVar72 = test_dropt_handle_uint(context,"-3000000000",6,0xcafebabe,0xcafebabe,0x238);
      bVar73 = test_dropt_handle_uint(context,"5000000000",7,0xcafebabe,0xcafebabe,0x239);
      bVar74 = test_dropt_handle_double(context,(dropt_char *)0x0,5,2.71828,2.71828,0x23b);
      bVar75 = test_dropt_handle_double(context,"",5,2.71828,2.71828,0x23c);
      bVar76 = test_dropt_handle_double(context," ",6,2.71828,2.71828,0x23d);
      bVar77 = test_dropt_handle_double(context,"123",0,123.0,0.0,0x23e);
      bVar78 = test_dropt_handle_double(context,"0123",0,123.0,0.0,0x23f);
      bVar79 = test_dropt_handle_double(context,"+123",0,123.0,0.0,0x240);
      bVar80 = test_dropt_handle_double(context,"-123",0,-123.0,0.0,0x241);
      bVar81 = test_dropt_handle_double(context,"12.3",0,12.3,0.0,0x242);
      bVar82 = test_dropt_handle_double(context,".123",0,0.123,0.0,0x243);
      bVar83 = test_dropt_handle_double(context,"123e-1",0,12.3,0.0,0x244);
      bVar84 = test_dropt_handle_double(context,"12.3e-1",0,1.23,0.0,0x245);
      bVar85 = test_dropt_handle_double(context,"a",6,2.71828,2.71828,0x246);
      bVar86 = test_dropt_handle_double(context,"123a",6,2.71828,2.71828,0x247);
      bVar87 = test_dropt_handle_double(context,"1e1024",7,2.71828,2.71828,0x248);
      bVar14 = bVar87 & bVar86 & bVar85 & bVar84 & bVar83 & bVar82 & bVar81 & bVar80 &
               bVar79 & bVar78 & bVar77 & bVar76 & bVar75 & bVar74 & bVar73 & bVar72 & bVar71 & 
                                                  bVar70 &
               bVar69 & bVar68 & bVar67 & bVar66 & bVar65 & bVar64 & bVar63 & bVar62 & bVar61 & 
                                                  bVar60 &
               bVar59 & bVar58 & bVar57 & bVar56 & bVar55 & bVar54 & bVar53 & bVar52 & bVar51 &
               bVar50 & bVar49 & bVar48 & bVar47 & bVar46 & bVar45 & bVar44 & bVar43 &
               bVar42 & bVar41 & bVar40 & bVar39 & bVar38 & bVar37 & bVar36 &
               bVar35 & bVar34 & bVar33 & bVar32 & bVar31 & bVar30 &
               bVar29 & bVar28 & bVar27 & bVar26 & bVar25 &
               bVar24 & bVar23 & bVar22 & bVar21 &
               bVar20 & bVar19 & bVar18 & bVar17 & bVar16 & bVar15 & bVar14;
      helpParams.indent = 0x95aaf790;
      helpParams.description_start_column = 0x4005bf09;
      uVar10 = dropt_handle_double(context,0,"1e-1024",&helpParams);
      if ((((uVar10 != 8) || ((double)helpParams._0_8_ != 2.71828)) ||
          (NAN((double)helpParams._0_8_))) &&
         (((uVar10 != 0 || ((double)helpParams._0_8_ != 0.0)) || (NAN((double)helpParams._0_8_)))))
      {
        bVar14 = false;
        fprintf(_stderr,
                "FAILED: dropt_handle_double(\"%s\") returned %d and output %g.  Expected (%d, %g) or (%d, %g).\n"
                ,helpParams._0_8_,0x4005bf0995aaf790,0,"1e-1024",(ulong)uVar10,8,0);
      }
      bVar15 = test_dropt_handle_string(context,(dropt_char *)0x0,5,"qux","qux",0x260);
      bVar16 = test_dropt_handle_string(context,"",0,"",(dropt_char *)0x0,0x261);
      bVar17 = test_dropt_handle_string(context," ",0," ",(dropt_char *)0x0,0x262);
      bVar18 = test_dropt_handle_string(context,"foo",0,"foo",(dropt_char *)0x0,0x263);
      bVar19 = test_dropt_handle_string(context,"foo bar",0,"foo bar",(dropt_char *)0x0,0x264);
      if ((bVar18 & bVar17 & bVar16 & bVar15 & bVar14 & bVar19) != false) {
        dropt_set_error_handler(context,my_dropt_error_handler,0);
        showHelp = '\0';
        quiet = '\0';
        allowConcatenatedArgs = '\0';
        normalFlag = '\0';
        requiredArgFlag = '\0';
        hiddenFlag = '\0';
        stringVal = (dropt_char *)0x0;
        stringVal2 = (dropt_char *)0x0;
        intVal = 0;
        optionalUInt.is_set = false;
        optionalUInt.value = 10;
        ipAddress = 0;
        bVar14 = test_dropt_parse(context);
        if (bVar14 != false) {
          showHelp = '\0';
          quiet = '\0';
          allowConcatenatedArgs = '\0';
          normalFlag = '\0';
          requiredArgFlag = '\0';
          hiddenFlag = '\0';
          stringVal = (dropt_char *)0x0;
          stringVal2 = (dropt_char *)0x0;
          intVal = 0;
          optionalUInt.is_set = false;
          optionalUInt.value = 10;
          ipAddress = 0;
          dropt_allow_concatenated_arguments(context,0);
          plVar91 = (long *)dropt_parse(context,0xffffffff,argv + 1);
          dVar88 = get_and_print_dropt_error(context);
          if (dVar88 != 0) {
            fputc(10,_stdout);
          }
          if (showHelp == '\0') {
            bVar92 = 0;
            if ((argc < 2) || (quiet != '\0')) goto LAB_00106742;
            pcVar89 = "(null)";
            if (stringVal != (dropt_char *)0x0) {
              pcVar89 = stringVal;
            }
            fprintf(_stdout,
                    "Compilation flags: %s%s%s\nnormalFlag: %u\nrequiredArgFlag: %u\nhiddenFlag: %u\nstring: %s\nintVal: %d\noptionalUInt: %u, value: %u\nipAddress: %u.%u.%u.%u (%u)\ntristate: %d\n\n"
                    ,"","","",(ulong)normalFlag,(ulong)requiredArgFlag,(ulong)hiddenFlag,pcVar89,
                    (ulong)(uint)intVal,(ulong)optionalUInt & 0xffffffff,(ulong)optionalUInt >> 0x20
                    ,(ulong)(ipAddress >> 0x18),(ulong)(ipAddress >> 0x10 & 0xff),
                    (ulong)(ipAddress >> 8 & 0xff),(ulong)(ipAddress & 0xff),(ulong)ipAddress,triVal
                   );
            fwrite("Rest:",5,1,_stdout);
            lVar90 = *plVar91;
            while (lVar90 != 0) {
              plVar91 = plVar91 + 1;
              fprintf(_stdout," %s");
              lVar90 = *plVar91;
            }
            fputc(10,_stdout);
          }
          else {
            fputs("Usage: test_dropt [options] [--] [operands]\n\n",_stdout);
            dropt_init_help_params(&helpParams);
            helpParams.description_start_column = 0x1e;
            helpParams.blank_lines_between_options = '\0';
            dropt_print_help(_stdout,context,&helpParams);
          }
          bVar92 = 0;
          goto LAB_00106742;
        }
      }
      bVar92 = 1;
      goto LAB_00106742;
    }
    main_cold_22();
  }
  context = (dropt_context *)0x0;
LAB_00106742:
  dropt_free_context(context);
  if (bVar92 != 0) {
    main_cold_23();
  }
  return (int)bVar92;
}

Assistant:

int
main(int argc, char** argv)
#endif
{
    dropt_char** rest;
    dropt_context* droptContext = NULL;

    bool success = test_strings();
    if (!success) { goto exit; }

    droptContext = dropt_new_context(options);
    if (droptContext == NULL)
    {
        fputts(T("Insufficient memory.\n"), stderr);
        success = false;
        goto exit;
    }

    success = test_dropt_handlers(droptContext);
    if (!success) { goto exit; }

    dropt_set_error_handler(droptContext, my_dropt_error_handler, NULL);

    init_option_defaults();
    success = test_dropt_parse(droptContext);
    if (!success) { goto exit; }

    init_option_defaults();
    dropt_allow_concatenated_arguments(droptContext, allowConcatenatedArgs);
    rest = dropt_parse(droptContext, -1, &argv[1]);

    /* Most programs normally should abort if given invalid arguments, but
     * for diagnostic purposes, this test program presses on anyway.
     */
    if (get_and_print_dropt_error(droptContext) != dropt_error_none)
    {
        fputtc(T('\n'), stdout);
    }

    if (showHelp)
    {
        fputts(T("Usage: test_dropt [options] [--] [operands]\n\n"), stdout);
#ifndef DROPT_NO_STRING_BUFFERS
        {
            dropt_help_params helpParams;
            dropt_init_help_params(&helpParams);
            helpParams.description_start_column = 30;
            helpParams.blank_lines_between_options = false;
            dropt_print_help(stdout, droptContext, &helpParams);
        }
#endif
        goto exit;
    }

    if (argc > 1 && !quiet)
    {
        dropt_char** arg;

        ftprintf(stdout, T("Compilation flags: %s%s%s\n")
                         T("normalFlag: %u\n")
                         T("requiredArgFlag: %u\n")
                         T("hiddenFlag: %u\n")
                         T("string: %s\n")
                         T("intVal: %d\n")
                         T("optionalUInt: %u, value: %u\n")
                         T("ipAddress: %u.%u.%u.%u (%u)\n")
                         T("tristate: %d\n")
                         T("\n"),
#ifdef NDEBUG
                 T("NDEBUG "),
#else
                 T(""),
#endif
#ifdef DROPT_NO_STRING_BUFFERS
                 T("DROPT_NO_STRING_BUFFERS "),
#else
                 T(""),
#endif
#ifdef DROPT_USE_WCHAR
                 T("DROPT_USE_WCHAR "),
#else
                 T(""),
#endif
                 normalFlag, requiredArgFlag, hiddenFlag,
                 (stringVal == NULL) ? T("(null)") : stringVal,
                 intVal, optionalUInt.is_set, optionalUInt.value,
                 (ipAddress >> 24) & 0xFF,
                 (ipAddress >> 16) & 0xFF,
                 (ipAddress >> 8) & 0xFF,
                 ipAddress & 0xFF,
                 ipAddress,
                 triVal);
        ftprintf(stdout, T("Rest:"));
        for (arg = rest; *arg != NULL; arg++)
        {
            ftprintf(stdout, T(" %s"), *arg);
        }
        fputtc(T('\n'), stdout);
    }

exit:
    dropt_free_context(droptContext);

    if (!success) { fputts(T("One or more tests failed.\n"), stderr); }
    return success ? EXIT_SUCCESS : EXIT_FAILURE;
}